

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O0

void __thiscall
despot::TagSPParticleUpperBound::TagSPParticleUpperBound
          (TagSPParticleUpperBound *this,BaseTag *model)

{
  double dVar1;
  int iVar2;
  const_reference pvVar3;
  reference pvVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int dist;
  int opp;
  int rob;
  int s;
  undefined1 local_58 [8];
  Floor floor;
  BaseTag *model_local;
  TagSPParticleUpperBound *this_local;
  
  floor.dist_.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)model;
  despot::ParticleUpperBound::ParticleUpperBound(&this->super_ParticleUpperBound);
  *(undefined ***)this = &PTR__TagSPParticleUpperBound_00159778;
  this->tag_model_ =
       (BaseTag *)
       floor.dist_.
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<double,_std::allocator<double>_>::vector(&this->value_);
  Floor::Floor((Floor *)local_58,&this->tag_model_->floor_);
  iVar2 = (**(code **)(*(long *)this->tag_model_ + 0x10))();
  std::vector<double,_std::allocator<double>_>::resize(&this->value_,(long)iVar2);
  opp = 0;
  while( true ) {
    iVar2 = (**(code **)(*(long *)this->tag_model_ + 0x10))();
    if (iVar2 <= opp) break;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->tag_model_->rob_,(long)opp);
    iVar2 = *pvVar3;
    std::vector<int,_std::allocator<int>_>::operator[](&this->tag_model_->opp_,(long)opp);
    dVar5 = (double)despot::Floor::Distance((int)local_58,iVar2);
    dVar6 = Globals::Discount((int)dVar5);
    dVar7 = Globals::Discount();
    dVar1 = BaseTag::TAG_REWARD;
    dVar5 = Globals::Discount((int)dVar5);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&this->value_,(long)opp);
    *pvVar4 = dVar1 * dVar5 + -(1.0 - dVar6) / (1.0 - dVar7);
    opp = opp + 1;
  }
  Floor::~Floor((Floor *)local_58);
  return;
}

Assistant:

TagSPParticleUpperBound(const BaseTag* model) :
		tag_model_(model) {
		Floor floor = tag_model_->floor_;
		value_.resize(tag_model_->NumStates());
		for (int s = 0; s < tag_model_->NumStates(); s++) {
			int rob = tag_model_->rob_[s], opp = tag_model_->opp_[s];
			int dist = (int) floor.Distance(rob, opp);
			value_[s] = -(1 - Globals::Discount(dist)) / (1 - Globals::Discount())
				+ tag_model_->TAG_REWARD * Globals::Discount(dist);
		}
	}